

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O0

void __thiscall
pbrt::GBufferFilm::GBufferFilm
          (GBufferFilm *this,FilmBaseParameters *p,AnimatedTransform *outputFromRender,
          bool applyInverse,RGBColorSpace *colorSpace,Float maxComponentValue,bool writeFP16,
          Allocator alloc)

{
  Bounds2i extent;
  bool bVar1;
  int iVar2;
  Bounds2<int> *this_00;
  byte in_CL;
  void *in_RDX;
  Tuple2<pbrt::Point2,_int> in_RDI;
  undefined8 in_R8;
  byte in_R9B;
  long in_FS_OFFSET;
  undefined4 in_XMM0_Da;
  Float FVar3;
  undefined8 in_stack_00000008;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  FilmBaseParameters *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  Tuple2<pbrt::Point2,_int> TVar4;
  undefined1 local_d4 [20];
  char (*in_stack_ffffffffffffff40) [23];
  char *in_stack_ffffffffffffff48;
  char *file;
  LogLevel level;
  FilmBaseParameters *in_stack_ffffffffffffff68;
  FilmBase *in_stack_ffffffffffffff70;
  SquareMatrix<3> *in_stack_ffffffffffffff78;
  SquareMatrix<3> *in_stack_ffffffffffffff80;
  
  TVar4 = (Tuple2<pbrt::Point2,_int>)&stack0xffffffffffffff78;
  FilmBaseParameters::FilmBaseParameters
            (in_stack_ffffffffffffff00,
             (FilmBaseParameters *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  FilmBase::FilmBase(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  FilmBaseParameters::~FilmBaseParameters((FilmBaseParameters *)0x86f533);
  memcpy((void *)((long)in_RDI + 0x50),in_RDX,0x2b8);
  *(byte *)((long)in_RDI + 0x308) = in_CL & 1;
  file = *(char **)((long)in_RDI + 8);
  level = (LogLevel)((ulong)*(undefined8 *)((long)in_RDI + 0x10) >> 0x20);
  extent.pMax.super_Tuple2<pbrt::Point2,_int> = TVar4;
  extent.pMin.super_Tuple2<pbrt::Point2,_int> = in_RDI;
  iVar2 = in_stack_00000008._4_4_;
  Array2D<pbrt::GBufferFilm::Pixel>::Array2D
            ((Array2D<pbrt::GBufferFilm::Pixel> *)
             CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),extent,
             (memory_resource *)((long)in_RDI + 0x310));
  *(undefined8 *)((long)in_RDI + 0x330) = in_R8;
  *(undefined4 *)((long)in_RDI + 0x338) = in_XMM0_Da;
  *(byte *)((long)in_RDI + 0x33c) = in_R9B & 1;
  this_00 = (Bounds2<int> *)((long)in_RDI + 0x340);
  FVar3 = Filter::Integral((Filter *)this_00);
  *(Float *)&((TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
               *)&this_00->pMin)->bits = FVar3;
  SquareMatrix<3>::SquareMatrix((SquareMatrix<3> *)((long)in_RDI + 0x344));
  bVar1 = Bounds2<int>::IsEmpty((Bounds2<int> *)((long)in_RDI + 8));
  if (!bVar1) {
    iVar2 = Bounds2<int>::Area(this_00);
    *(long *)(in_FS_OFFSET + -0x98) = *(long *)(in_FS_OFFSET + -0x98) + (long)iVar2 * 0xc0;
    pbrt::operator*(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    memcpy((void *)((long)in_RDI + 0x344),local_d4,0x24);
    return;
  }
  LogFatal<char_const(&)[23]>(level,file,iVar2,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
}

Assistant:

GBufferFilm::GBufferFilm(FilmBaseParameters p, const AnimatedTransform &outputFromRender,
                         bool applyInverse, const RGBColorSpace *colorSpace,
                         Float maxComponentValue, bool writeFP16, Allocator alloc)
    : FilmBase(p),
      outputFromRender(outputFromRender),
      applyInverse(applyInverse),
      pixels(pixelBounds, alloc),
      colorSpace(colorSpace),
      maxComponentValue(maxComponentValue),
      writeFP16(writeFP16),
      filterIntegral(filter.Integral()) {
    CHECK(!pixelBounds.IsEmpty());
    filmPixelMemory += pixelBounds.Area() * sizeof(Pixel);
    outputRGBFromSensorRGB = colorSpace->RGBFromXYZ * sensor->XYZFromSensorRGB;
}